

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraLcr.c
# Opt level: O3

int Fra_LcrNodeIsConst(Aig_Obj_t *pObj)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  
  if ((*(uint *)&pObj->field_0x18 & 7) != 2) {
    __assert_fail("Aig_ObjIsCi(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraLcr.c"
                  ,0xf6,"int Fra_LcrNodeIsConst(Aig_Obj_t *)");
  }
  lVar3 = *(long *)((long)(pObj->field_5).pData + 0x40);
  iVar1 = *(int *)(*(long *)(lVar3 + 0x18) + (long)(pObj->field_0).pNext * 4);
  if ((-1 < (long)iVar1) && (iVar1 < *(int *)(*(long *)(lVar3 + 0x28) + 4))) {
    iVar2 = *(int *)(*(long *)(lVar3 + 0x20) + (long)(pObj->field_0).pNext * 4);
    if (-1 < (long)iVar2) {
      lVar3 = *(long *)(*(long *)(*(long *)(lVar3 + 0x28) + 8) + (long)iVar1 * 8);
      lVar4 = *(long *)(lVar3 + 0x18);
      if (iVar2 < *(int *)(lVar4 + 4)) {
        return (int)(*(ulong *)(lVar3 + 0x30) ==
                    (*(ulong *)(*(long *)(*(long *)(lVar4 + 8) + (long)iVar2 * 8) + 8) &
                    0xfffffffffffffffe));
      }
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

int Fra_LcrNodeIsConst( Aig_Obj_t * pObj )
{
    Fra_Man_t * pTemp = (Fra_Man_t *)pObj->pData;
    Fra_Lcr_t * pLcr = (Fra_Lcr_t *)pTemp->pBmc;
    Aig_Man_t * pFraig;
    Aig_Obj_t * pOut;
    int nPart;
    assert( Aig_ObjIsCi(pObj) );
    // find the partition to which these nodes belong
    nPart = pLcr->pInToOutPart[(long)pObj->pNext];
    pFraig = (Aig_Man_t *)Vec_PtrEntry( pLcr->vFraigs, nPart );
    // get the fraig outputs
    pOut = Aig_ManCo( pFraig, pLcr->pInToOutNum[(long)pObj->pNext] );
    return Aig_ObjFanin0(pOut) == Aig_ManConst1(pFraig);
}